

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

auto_fft_object auto_fft_init(int N)

{
  int N_00;
  auto_fft_object paVar1;
  fft_real_object pfVar2;
  
  paVar1 = (auto_fft_object)malloc(0x18);
  N_00 = findnexte(N * 2);
  paVar1->clen = N_00;
  paVar1->ilen = N;
  pfVar2 = fft_real_init(N_00,1);
  paVar1->fobj = pfVar2;
  pfVar2 = fft_real_init(N_00,-1);
  paVar1->iobj = pfVar2;
  return paVar1;
}

Assistant:

auto_fft_object auto_fft_init(int N) {
	auto_fft_object obj = NULL;

		
	obj = (auto_fft_object) malloc (sizeof(struct auto_set));
	 
	//obj->clen = npow2(conv_len);
	//obj->clen = conv_len;
	obj->clen = findnexte(2*N);
	//obj->clen = 125;
	obj->ilen = N;
	
	obj->fobj = fft_real_init(obj->clen,1);
	obj->iobj = fft_real_init(obj->clen,-1);
	
	return obj;
}